

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_poly.c
# Opt level: O1

mpt_value * iterPolyValue(mpt_iterator *it)

{
  int iVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  _mpt_vptr_iterator *p_Var6;
  _mpt_vptr_iterator *p_Var7;
  _mpt_vptr_iterator *p_Var8;
  
  p_Var6 = it[4]._vptr;
  if (p_Var6 == (_mpt_vptr_iterator *)0x0) {
    if ((long)it[5]._vptr < 0xffffffff) {
      p_Var6 = (_mpt_vptr_iterator *)(double)(long)it[5]._vptr;
      goto LAB_00109d97;
    }
  }
  else if ((long)it[5]._vptr < (long)((ulong)p_Var6[1].value >> 3)) {
    p_Var6 = (_mpt_vptr_iterator *)(&p_Var6[1].advance)[(long)it[5]._vptr];
LAB_00109d97:
    if (it[2]._vptr != (_mpt_vptr_iterator *)0x0) {
      return (mpt_value *)(it + 1);
    }
    iVar1 = *(int *)&it[6]._vptr;
    p_Var7 = p_Var6;
    if ((long)iVar1 != 0) {
      if (iVar1 < 1) {
        p_Var7 = (_mpt_vptr_iterator *)0x0;
      }
      else {
        p_Var7 = (_mpt_vptr_iterator *)0x0;
        lVar3 = 0;
        iVar2 = iVar1;
        do {
          iVar2 = iVar2 + -1;
          lVar4 = lVar3 + 1;
          p_Var8 = it[lVar3 * 2 + 8]._vptr;
          if ((int)lVar4 < iVar1) {
            iVar5 = iVar2;
            do {
              p_Var8 = (_mpt_vptr_iterator *)
                       ((double)p_Var8 * ((double)it[lVar3 * 2 + 7]._vptr + (double)p_Var6));
              iVar5 = iVar5 + -1;
            } while (iVar5 != 0);
          }
          p_Var7 = (_mpt_vptr_iterator *)((double)p_Var7 + (double)p_Var8);
          lVar3 = lVar4;
        } while (lVar4 != iVar1);
      }
    }
    it[3]._vptr = p_Var7;
    it[1]._vptr = (_mpt_vptr_iterator *)(it + 3);
    it[2]._vptr = (_mpt_vptr_iterator *)0x64;
    return (mpt_value *)(it + 1);
  }
  return (mpt_value *)0x0;
}

Assistant:

static const MPT_STRUCT(value) *iterPolyValue(MPT_INTERFACE(iterator) *it)
{
	MPT_STRUCT(iteratorPolynom) *d = MPT_baseaddr(iteratorPolynom, it, _it);
	MPT_STRUCT(buffer) *buf;
	double sum, val;
	long max, j;
	
	/* check limits and set initial value */
	if ((buf = d->grid._buf)) {
		const double *src = (void *) (buf + 1);
		max = buf->_used / sizeof(double);
		if (d->pos >= max) {
			return 0;
		}
		val = src[d->pos];
	}
	else if (d->pos >= UINT_MAX) {
		return 0;
	}
	else {
		val = d->pos;
	}
	/* reuse calculations of previous call */
	if (d->val._type) {
		return &d->val;
	}
	/* no coefficients */
	if (!(max = d->coeff)) {
		sum = val;
	}
	/* calculate polynom */
	else {
		const struct coeff_poly *coeff = (void *) (d + 1);
		for (j = 0, sum = 0.0; j < max; j++) {
			double prod, tmp = val;
			int k;
			
			tmp += coeff[j].shift;
			
			for (k = j + 1, prod = coeff[j].mult; k < max; k++) {
				prod *= tmp;
			}
			sum += prod;
		}
	}
	/* assign new value */
	d->curr = sum;
	MPT_value_set(&d->val, 'd', &d->curr);
	
	return &d->val;
}